

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::TTDebuggerSourceLocation::SetLocationCopy
          (TTDebuggerSourceLocation *this,TTDebuggerSourceLocation *other)

{
  TTDebuggerSourceLocation *other_local;
  TTDebuggerSourceLocation *this_local;
  
  this->m_sourceScriptLogId = other->m_sourceScriptLogId;
  this->m_bpId = other->m_bpId;
  this->m_etime = other->m_etime;
  this->m_ftime = other->m_ftime;
  this->m_ltime = other->m_ltime;
  this->m_topLevelBodyId = other->m_topLevelBodyId;
  this->m_functionLine = other->m_functionLine;
  this->m_functionColumn = other->m_functionColumn;
  this->m_line = other->m_line;
  this->m_column = other->m_column;
  return;
}

Assistant:

void TTDebuggerSourceLocation::SetLocationCopy(const TTDebuggerSourceLocation& other)
    {
        this->m_sourceScriptLogId = other.m_sourceScriptLogId;
        this->m_bpId = other.m_bpId;

        this->m_etime = other.m_etime;
        this->m_ftime = other.m_ftime;
        this->m_ltime = other.m_ltime;

        this->m_topLevelBodyId = other.m_topLevelBodyId;

        this->m_functionLine = other.m_functionLine;
        this->m_functionColumn = other.m_functionColumn;

        this->m_line = other.m_line;
        this->m_column = other.m_column;
    }